

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall rest_rpc::rpc_client::rpc_client(rpc_client *this)

{
  io_context *this_00;
  _Rb_tree_header *p_Var1;
  __shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> local_48;
  rpc_client *local_38;
  
  this_00 = &this->ios_;
  asio::io_context::io_context(this_00);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,this_00,0);
  std::make_shared<asio::io_context::work,asio::io_context&>((io_context *)&this->work_);
  (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  this->port_ = 0;
  this->connect_timeout_ = 1000;
  this->reconnect_cnt_ = -1;
  (this->has_connected_)._M_base._M_i = false;
  (this->conn_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->conn_mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->conn_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->conn_mtx_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->conn_mtx_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->conn_cond_);
  this->has_wait_ = false;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer<asio::io_context>(&this->deadline_,this_00,0);
  this->stop_client_ = false;
  std::
  _Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ::_Deque_base(&(this->outbox_).
                 super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
               );
  this->write_size_ = 0;
  (this->write_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->write_mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->write_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->write_mtx_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->write_mtx_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->fu_id_ = 0;
  *(undefined8 *)&(this->err_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->err_cb_).super__Function_base._M_functor + 8) = 0;
  (this->err_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->err_cb_)._M_invoker = (_Invoker_type)0x0;
  this->enable_reconnect_ = false;
  (this->future_map_)._M_h._M_buckets = &(this->future_map_)._M_h._M_single_bucket;
  (this->future_map_)._M_h._M_bucket_count = 1;
  (this->future_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->future_map_)._M_h._M_element_count = 0;
  (this->future_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->future_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->future_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->callback_map_)._M_h._M_buckets = &(this->callback_map_)._M_h._M_single_bucket;
  (this->callback_map_)._M_h._M_bucket_count = 1;
  (this->callback_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->callback_map_)._M_h._M_element_count = 0;
  (this->callback_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->callback_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->callback_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cb_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cb_mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->cb_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cb_mtx_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->cb_mtx_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->callback_id_ = 0;
  this->temp_req_id_ = 0;
  this->head_[0] = '\0';
  this->head_[1] = '\0';
  this->head_[2] = '\0';
  this->head_[3] = '\0';
  this->head_[4] = '\0';
  this->head_[5] = '\0';
  this->head_[6] = '\0';
  this->head_[7] = '\0';
  this->head_[4] = '\0';
  this->head_[5] = '\0';
  this->head_[6] = '\0';
  this->head_[7] = '\0';
  this->head_[8] = '\0';
  this->head_[9] = '\0';
  this->head_[10] = '\0';
  this->head_[0xb] = '\0';
  this->head_[0xc] = '\0';
  this->head_[0xd] = '\0';
  this->head_[0xe] = '\0';
  this->head_[0xf] = '\0';
  this->head_[0x10] = '\0';
  this->head_[0x11] = '\0';
  this->head_[0x12] = '\0';
  this->head_[0x13] = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->body_,0x800,(allocator_type *)&local_48);
  (this->sub_map_)._M_h._M_buckets = &(this->sub_map_)._M_h._M_single_bucket;
  (this->sub_map_)._M_h._M_bucket_count = 1;
  (this->sub_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sub_map_)._M_h._M_element_count = 0;
  (this->sub_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sub_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sub_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->key_token_set_)._M_t._M_impl.super__Rb_tree_header;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->client_language_ = CPP;
  *(undefined8 *)&(this->on_result_received_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_result_received_callback_).super__Function_base._M_functor + 8) =
       0;
  (this->on_result_received_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->on_result_received_callback_)._M_invoker = (_Invoker_type)0x0;
  local_38 = this;
  std::make_shared<std::thread,rest_rpc::rpc_client::rpc_client()::_lambda()_1_>
            ((anon_class_8_1_8991fb9c_for__M_head_impl *)&local_48);
  std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

rpc_client()
      : socket_(ios_), work_(std::make_shared<asio::io_context::work>(ios_)),
        deadline_(ios_), body_(INIT_BUF_SIZE) {
    thd_ = std::make_shared<std::thread>([this] { ios_.run(); });
  }